

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_base.hpp
# Opt level: O2

void boost::detail::function::
     functor_manager_common<boost::_bi::bind_t<void,_void_(*)(boost::unit_test::test_suite_*(*)(int,_char_**)),_boost::_bi::list1<boost::_bi::value<boost::unit_test::test_suite_*(*)(int,_char_**)>_>_>_>
     ::manage_small(function_buffer *in_buffer,function_buffer *out_buffer,
                   functor_manager_operation_type op)

{
  undefined8 uVar1;
  bool bVar2;
  functor_type *in_functor;
  pointer_____offset_0x10___ *local_18;
  
  if (op < destroy_functor_tag) {
    uVar1 = *(undefined8 *)(in_buffer->data + 8);
    *(undefined8 *)out_buffer = *(undefined8 *)in_buffer;
    *(undefined8 *)(out_buffer->data + 8) = uVar1;
  }
  else if (op != destroy_functor_tag) {
    if (op == check_functor_type_tag) {
      local_18 = &_bi::
                  bind_t<void,void(*)(boost::unit_test::test_suite*(*)(int,char**)),boost::_bi::list1<boost::_bi::value<boost::unit_test::test_suite*(*)(int,char**)>>>
                  ::typeinfo;
      bVar2 = typeindex::operator==
                        (*(type_info **)out_buffer,
                         (type_index_facade<boost::typeindex::stl_type_index,_std::type_info> *)
                         &local_18);
      if (bVar2) {
        *(function_buffer **)out_buffer = in_buffer;
      }
      else {
        *(undefined8 *)out_buffer = 0;
      }
    }
    else {
      *(pointer_____offset_0x10___ **)out_buffer =
           &_bi::
            bind_t<void,void(*)(boost::unit_test::test_suite*(*)(int,char**)),boost::_bi::list1<boost::_bi::value<boost::unit_test::test_suite*(*)(int,char**)>>>
            ::typeinfo;
      *(char *)((long)out_buffer + 8) = '\0';
      *(char *)((long)out_buffer + 9) = '\0';
    }
  }
  return;
}

Assistant:

static inline void
        manage_small(const function_buffer& in_buffer, function_buffer& out_buffer,
                functor_manager_operation_type op)
        {
          if (op == clone_functor_tag || op == move_functor_tag) {
            const functor_type* in_functor =
              reinterpret_cast<const functor_type*>(in_buffer.data);
            new (reinterpret_cast<void*>(out_buffer.data)) functor_type(*in_functor);

            if (op == move_functor_tag) {
              functor_type* f = reinterpret_cast<functor_type*>(in_buffer.data);
              (void)f; // suppress warning about the value of f not being used (MSVC)
              f->~Functor();
            }
          } else if (op == destroy_functor_tag) {
            // Some compilers (Borland, vc6, ...) are unhappy with ~functor_type.
             functor_type* f = reinterpret_cast<functor_type*>(out_buffer.data);
             (void)f; // suppress warning about the value of f not being used (MSVC)
             f->~Functor();
          } else if (op == check_functor_type_tag) {
             if (*out_buffer.members.type.type == boost::typeindex::type_id<Functor>())
              out_buffer.members.obj_ptr = in_buffer.data;
            else
              out_buffer.members.obj_ptr = 0;
          } else /* op == get_functor_type_tag */ {
            out_buffer.members.type.type = &boost::typeindex::type_id<Functor>().type_info();
            out_buffer.members.type.const_qualified = false;
            out_buffer.members.type.volatile_qualified = false;
          }
        }